

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# starting_basis.cc
# Opt level: O1

void ipx::StartingBasis(Iterate *iterate,Basis *p_basis,Info *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Model *pMVar4;
  pointer pdVar5;
  double *pdVar6;
  iterator iVar7;
  int iVar8;
  double *colscale;
  long lVar9;
  pointer piVar10;
  long lVar11;
  size_t sVar12;
  double *pdVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  Int *pIVar17;
  int *piVar18;
  double dVar19;
  Vector dxbasic;
  vector<int,_std::allocator<int>_> dependent_rows;
  Vector dy;
  vector<int,_std::allocator<int>_> dependent_cols;
  Timer timer;
  int local_ac;
  double *local_a8;
  Info *local_a0;
  Vector local_98;
  vector<int,_std::allocator<int>_> local_88;
  Vector local_68;
  Int *local_58;
  iterator iStack_50;
  int *local_48;
  ulong local_40;
  Timer local_38;
  
  pMVar4 = iterate->model_;
  uVar15 = (long)pMVar4->num_cols_ + (long)pMVar4->num_rows_;
  colscale = (double *)operator_new(uVar15 * 8);
  memset(colscale,0,uVar15 * 8);
  (info->super_ipx_info).errflag = 0;
  local_a0 = info;
  Timer::Timer(&local_38);
  iVar8 = (int)uVar15;
  if (0 < iVar8) {
    uVar14 = 0;
    do {
      dVar19 = Iterate::ScalingFactor(iterate,(Int)uVar14);
      colscale[uVar14] = dVar19;
      dVar19 = (pMVar4->lb_)._M_data[uVar14];
      pdVar13 = (pMVar4->ub_)._M_data + uVar14;
      if ((dVar19 == *pdVar13) && (!NAN(dVar19) && !NAN(*pdVar13))) {
        colscale[uVar14] = 0.0;
      }
      uVar14 = uVar14 + 1;
    } while ((uVar15 & 0xffffffff) != uVar14);
  }
  Basis::ConstructBasisFromWeights(p_basis,colscale,local_a0);
  if ((local_a0->super_ipx_info).errflag == 0) {
    if (0 < iVar8) {
      uVar14 = 0;
      do {
        if (ABS(colscale[uVar14]) == 0.0 || ABS(colscale[uVar14]) == INFINITY) {
          if ((p_basis->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14] < 0) {
            Basis::FixNonbasicVariable(p_basis,(Int)uVar14);
          }
          else {
            Basis::FreeBasicVariable(p_basis,(Int)uVar14);
          }
        }
        uVar14 = uVar14 + 1;
      } while ((uVar15 & 0xffffffff) != uVar14);
    }
    if (0 < iVar8) {
      uVar14 = 0;
      do {
        dVar19 = (pMVar4->lb_)._M_data[uVar14];
        pdVar13 = (pMVar4->ub_)._M_data + uVar14;
        if (((dVar19 == *pdVar13) && (!NAN(dVar19) && !NAN(*pdVar13))) &&
           ((p_basis->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14] < -1)) {
          Iterate::make_fixed(iterate,(Int)uVar14,dVar19);
        }
        uVar14 = uVar14 + 1;
      } while ((uVar15 & 0xffffffff) != uVar14);
    }
    pMVar4 = iterate->model_;
    iVar8 = pMVar4->num_rows_;
    sVar16 = (size_t)iVar8;
    iVar1 = pMVar4->num_cols_;
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_48 = (int *)0x0;
    local_58 = (Int *)0x0;
    iStack_50._M_current = (Int *)0x0;
    uVar15 = (long)(iVar1 + iVar8) << 3;
    local_a8 = (double *)operator_new(uVar15);
    memset(local_a8,0,uVar15);
    uVar15 = sVar16 * 8;
    local_68._M_size = sVar16;
    local_68._M_data = (double *)operator_new(uVar15);
    local_40 = uVar15;
    memset(local_68._M_data,0,uVar15);
    pdVar13 = local_a8;
    if (0 < (local_a0->super_ipx_info).dependent_cols) {
      local_98._M_size = sVar16;
      local_98._M_data = (double *)operator_new(local_40);
      memset(local_98._M_data,0,local_40);
      local_ac = 0;
      if (0 < iVar1) {
        do {
          lVar9 = (long)local_ac;
          if (((ABS((pMVar4->lb_)._M_data[lVar9]) == INFINITY) &&
              (ABS((pMVar4->ub_)._M_data[lVar9]) == INFINITY)) &&
             ((p_basis->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9] < 0)) {
            pdVar13 = (iterate->x_)._M_data;
            local_a8[lVar9] = -pdVar13[lVar9];
            piVar10 = (pMVar4->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar2 = piVar10[lVar9];
            lVar11 = (long)iVar2;
            iVar3 = piVar10[lVar9 + 1];
            if (iVar2 < iVar3) {
              dVar19 = pdVar13[lVar9];
              piVar10 = (pMVar4->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar5 = (pMVar4->AI_).values_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              do {
                iVar2 = piVar10[lVar11];
                local_98._M_data[iVar2] = pdVar5[lVar11] * dVar19 + local_98._M_data[iVar2];
                lVar11 = lVar11 + 1;
              } while (iVar3 != lVar11);
            }
            if (iStack_50._M_current == local_48) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_58,iStack_50,&local_ac);
            }
            else {
              *iStack_50._M_current = local_ac;
              iStack_50._M_current = iStack_50._M_current + 1;
            }
          }
          local_ac = local_ac + 1;
        } while (local_ac < iVar1);
      }
      Basis::SolveDense(p_basis,&local_98,&local_98,'N');
      pdVar13 = local_a8;
      if (0 < iVar8) {
        piVar10 = (p_basis->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar12 = 0;
        do {
          local_a8[piVar10[sVar12]] = local_98._M_data[sVar12];
          sVar12 = sVar12 + 1;
        } while (sVar16 != sVar12);
      }
      operator_delete(local_98._M_data);
    }
    if (0 < (local_a0->super_ipx_info).dependent_rows) {
      if (0 < iVar8) {
        sVar12 = 0;
        do {
          iVar8 = (p_basis->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar12];
          if (iVar1 <= iVar8) {
            dVar19 = (pMVar4->lb_)._M_data[iVar8];
            pdVar13 = (pMVar4->ub_)._M_data + iVar8;
            if ((dVar19 == *pdVar13) && (!NAN(dVar19) && !NAN(*pdVar13))) {
              iVar8 = iVar8 - iVar1;
              local_68._M_data[sVar12] = -(iterate->y_)._M_data[iVar8];
              local_98._M_size = CONCAT44(local_98._M_size._4_4_,iVar8);
              if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_88,
                           (iterator)
                           local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_98);
              }
              else {
                *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar8;
                local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
          }
          sVar12 = sVar12 + 1;
        } while (sVar16 != sVar12);
      }
      pdVar13 = local_a8;
      Basis::SolveDense(p_basis,&local_68,&local_68,'T');
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        pdVar6 = (iterate->y_)._M_data;
        piVar10 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          local_68._M_data[*piVar10] = -pdVar6[*piVar10];
          piVar10 = piVar10 + 1;
        } while (piVar10 !=
                 local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
    }
    Iterate::Update(iterate,1.0,pdVar13,(double *)0x0,(double *)0x0,1.0,local_68._M_data,
                    (double *)0x0,(double *)0x0);
    iVar7._M_current = iStack_50._M_current;
    for (pIVar17 = local_58;
        piVar10 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish,
        piVar18 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start, pIVar17 != iVar7._M_current;
        pIVar17 = pIVar17 + 1) {
      Iterate::make_fixed(iterate,*pIVar17,0.0);
    }
    for (; piVar18 != piVar10; piVar18 = piVar18 + 1) {
      Iterate::make_implied_eq(iterate,*piVar18 + iVar1);
    }
    operator_delete(local_68._M_data);
    operator_delete(pdVar13);
    if (local_58 != (Int *)0x0) {
      operator_delete(local_58);
    }
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Basis::model(p_basis);
    dVar19 = Timer::Elapsed(&local_38);
    (local_a0->super_ipx_info).time_starting_basis =
         dVar19 + (local_a0->super_ipx_info).time_starting_basis;
  }
  operator_delete(colscale);
  return;
}

Assistant:

void StartingBasis(Iterate* iterate, Basis* p_basis, Info* info) {
    const Model& model = iterate->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    Vector colscale(n+m);
    Basis& basis = *p_basis;
    info->errflag = 0;
    Timer timer;

    // Construct starting basis. The column weights for the crash procedure are
    // the interior point scaling factors from the current iterate, except that
    // fixed variables get weight zero.
    for (Int j = 0; j < n+m; j++) {
        colscale[j] = iterate->ScalingFactor(j);
        if (std::isinf(lb[j]) && std::isinf(ub[j]))
            assert(colscale[j] == INFINITY);
        else
            assert(std::isfinite(colscale[j]));
        if (lb[j] == ub[j])
            colscale[j] = 0.0;
    }
    basis.ConstructBasisFromWeights(&colscale[0], info);
    if (info->errflag)
        return;

    // Change status of free variables either to BASIC_FREE or NONBASIC_FIXED.
    // Change status of fixed variables either to NONBASIC_FIXED or BASIC_FREE.
    for (Int j = 0; j < n+m; j++) {
        if (colscale[j] == 0.0 || std::isinf(colscale[j])) {
            if (basis.IsBasic(j))
                basis.FreeBasicVariable(j);
            else
                basis.FixNonbasicVariable(j);
        }
    }

    // Variables with equal lower and upper bounds can be removed from the
    // interior point solve if their basic status is NONBASIC_FIXED. Setting
    // x[j] to its bound alters the residual in AI*x=b; this can be ignored
    // because the iterate has not been primal feasible if x[j] was
    // significantly away from its bound.
    for (Int j = 0; j < n+m; j++) {
        if (lb[j] == ub[j] && basis.StatusOf(j) == Basis::NONBASIC_FIXED)
            iterate->make_fixed(j, lb[j]);
    }

    // Linearly dependent rows and columns require adjusting the iterate.
    PostprocessDependencies(iterate, p_basis, info);

    AssertConsistency(*iterate, basis);
    info->time_starting_basis += timer.Elapsed();
}